

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_evict(ASMState *as,RegSet allow)

{
  Reg RVar1;
  uint uVar2;
  uint in_ESI;
  uint *in_RDI;
  IRIns *ir;
  RegCost cost;
  IRRef ref;
  long in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (in_ESI < 0x10000) {
    if (((in_ESI & 1) != 0) && (*in_RDI != 0xffffffff)) {
      uVar3 = *in_RDI;
    }
    if (((in_ESI & 2) != 0) && (in_RDI[1] < uVar3)) {
      uVar3 = in_RDI[1];
    }
    if (((in_ESI & 4) != 0) && (in_RDI[2] < uVar3)) {
      uVar3 = in_RDI[2];
    }
    if (((in_ESI & 8) != 0) && (in_RDI[3] < uVar3)) {
      uVar3 = in_RDI[3];
    }
    if (((in_ESI & 0x20) != 0) && (in_RDI[5] < uVar3)) {
      uVar3 = in_RDI[5];
    }
    if (((in_ESI & 0x40) != 0) && (in_RDI[6] < uVar3)) {
      uVar3 = in_RDI[6];
    }
    if (((in_ESI & 0x80) != 0) && (in_RDI[7] < uVar3)) {
      uVar3 = in_RDI[7];
    }
    if (((in_ESI & 0x100) != 0) && (in_RDI[8] < uVar3)) {
      uVar3 = in_RDI[8];
    }
    if (((in_ESI & 0x200) != 0) && (in_RDI[9] < uVar3)) {
      uVar3 = in_RDI[9];
    }
    if (((in_ESI & 0x400) != 0) && (in_RDI[10] < uVar3)) {
      uVar3 = in_RDI[10];
    }
    if (((in_ESI & 0x800) != 0) && (in_RDI[0xb] < uVar3)) {
      uVar3 = in_RDI[0xb];
    }
    if (((in_ESI & 0x1000) != 0) && (in_RDI[0xc] < uVar3)) {
      uVar3 = in_RDI[0xc];
    }
    if (((in_ESI & 0x2000) != 0) && (in_RDI[0xd] < uVar3)) {
      uVar3 = in_RDI[0xd];
    }
    if (((in_ESI & 0x4000) != 0) && (in_RDI[0xe] < uVar3)) {
      uVar3 = in_RDI[0xe];
    }
    if (((in_ESI & 0x8000) != 0) && (in_RDI[0xf] < uVar3)) {
      uVar3 = in_RDI[0xf];
    }
  }
  else {
    if (((in_ESI & 0x10000) != 0) && (in_RDI[0x10] != 0xffffffff)) {
      uVar3 = in_RDI[0x10];
    }
    if (((in_ESI & 0x20000) != 0) && (in_RDI[0x11] < uVar3)) {
      uVar3 = in_RDI[0x11];
    }
    if (((in_ESI & 0x40000) != 0) && (in_RDI[0x12] < uVar3)) {
      uVar3 = in_RDI[0x12];
    }
    if (((in_ESI & 0x80000) != 0) && (in_RDI[0x13] < uVar3)) {
      uVar3 = in_RDI[0x13];
    }
    if (((in_ESI & 0x100000) != 0) && (in_RDI[0x14] < uVar3)) {
      uVar3 = in_RDI[0x14];
    }
    if (((in_ESI & 0x200000) != 0) && (in_RDI[0x15] < uVar3)) {
      uVar3 = in_RDI[0x15];
    }
    if (((in_ESI & 0x400000) != 0) && (in_RDI[0x16] < uVar3)) {
      uVar3 = in_RDI[0x16];
    }
    if (((in_ESI & 0x800000) != 0) && (in_RDI[0x17] < uVar3)) {
      uVar3 = in_RDI[0x17];
    }
    if (((in_ESI & 0x1000000) != 0) && (in_RDI[0x18] < uVar3)) {
      uVar3 = in_RDI[0x18];
    }
    if (((in_ESI & 0x2000000) != 0) && (in_RDI[0x19] < uVar3)) {
      uVar3 = in_RDI[0x19];
    }
    if (((in_ESI & 0x4000000) != 0) && (in_RDI[0x1a] < uVar3)) {
      uVar3 = in_RDI[0x1a];
    }
    if (((in_ESI & 0x8000000) != 0) && (in_RDI[0x1b] < uVar3)) {
      uVar3 = in_RDI[0x1b];
    }
    if (((in_ESI & 0x10000000) != 0) && (in_RDI[0x1c] < uVar3)) {
      uVar3 = in_RDI[0x1c];
    }
    if (((in_ESI & 0x20000000) != 0) && (in_RDI[0x1d] < uVar3)) {
      uVar3 = in_RDI[0x1d];
    }
    if (((in_ESI & 0x40000000) != 0) && (in_RDI[0x1e] < uVar3)) {
      uVar3 = in_RDI[0x1e];
    }
    if (((in_ESI & 0x80000000) != 0) && (in_RDI[0x1f] < uVar3)) {
      uVar3 = in_RDI[0x1f];
    }
  }
  if (((0x7fff < (uVar3 & 0xffff)) && ((in_RDI[0x2c] & in_ESI) != 0)) &&
     (in_stack_ffffffffffffffe0 = *(long *)(in_RDI + 0x24) + (ulong)(uVar3 & 0xffff) * 8,
     (in_RDI[0x2c] >> (*(byte *)(in_stack_ffffffffffffffe0 + 6) & 0x1f) & 1) == 0)) {
    for (uVar2 = in_RDI[0x2c] & in_ESI; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
    }
  }
  RVar1 = ra_restore((ASMState *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),
                     (IRRef)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  return RVar1;
}

Assistant:

static Reg ra_evict(ASMState *as, RegSet allow)
{
  IRRef ref;
  RegCost cost = ~(RegCost)0;
  lj_assertA(allow != RSET_EMPTY, "evict from empty set");
  if (RID_NUM_FPR == 0 || allow < RID2RSET(RID_MAX_GPR)) {
    GPRDEF(MINCOST)
  } else {
    FPRDEF(MINCOST)
  }
  ref = regcost_ref(cost);
  lj_assertA(ra_iskref(ref) || (ref >= as->T->nk && ref < as->T->nins),
	     "evict of out-of-range IR %04d", ref - REF_BIAS);
  /* Preferably pick any weak ref instead of a non-weak, non-const ref. */
  if (!irref_isk(ref) && (as->weakset & allow)) {
    IRIns *ir = IR(ref);
    if (!rset_test(as->weakset, ir->r))
      ref = regcost_ref(as->cost[rset_pickbot((as->weakset & allow))]);
  }
  return ra_restore(as, ref);
}